

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O1

void __thiscall
brotli::ZopfliCostModel::SetFromLiteralCosts
          (ZopfliCostModel *this,size_t num_bytes,size_t position,uint8_t *ringbuffer,
          size_t ringbuffer_mask)

{
  pointer pdVar1;
  size_t sVar2;
  uint32_t i;
  ulong uVar3;
  double dVar4;
  vector<float,_std::allocator<float>_> literal_cost;
  allocator_type local_51;
  size_t local_50;
  vector<float,_std::allocator<float>_> local_48;
  
  local_50 = ringbuffer_mask;
  std::vector<float,_std::allocator<float>_>::vector(&local_48,num_bytes + 1,&local_51);
  EstimateBitCostsForLiterals
            (position,num_bytes,local_50,ringbuffer,
             local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<double,_std::allocator<double>_>::resize(&this->literal_costs_,num_bytes + 1);
  pdVar1 = (this->literal_costs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar1 = 0.0;
  if (num_bytes != 0) {
    dVar4 = *pdVar1;
    sVar2 = 0;
    do {
      dVar4 = dVar4 + (double)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start[sVar2];
      pdVar1[sVar2 + 1] = dVar4;
      sVar2 = sVar2 + 1;
    } while (num_bytes != sVar2);
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->cost_cmd_,0x2c0);
  std::vector<double,_std::allocator<double>_>::resize(&this->cost_dist_,0x208);
  uVar3 = 0;
  do {
    if (uVar3 < 0xf5) {
      dVar4 = (double)*(float *)(&DAT_001bda9c + uVar3 * 4);
    }
    else {
      dVar4 = log2((double)((int)uVar3 + 0xb));
    }
    (this->cost_cmd_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3] = dVar4;
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x2c0);
  uVar3 = 0;
  do {
    if (uVar3 < 0xec) {
      dVar4 = (double)*(float *)(&DAT_001bdac0 + uVar3 * 4);
    }
    else {
      dVar4 = log2((double)((int)uVar3 + 0x14));
    }
    (this->cost_dist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3] = dVar4;
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x208);
  this->min_cost_cmd_ = 3.4594316482543945;
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SetFromLiteralCosts(size_t num_bytes,
                           size_t position,
                           const uint8_t* ringbuffer,
                           size_t ringbuffer_mask) {
    std::vector<float> literal_cost(num_bytes + 1);
    EstimateBitCostsForLiterals(position, num_bytes, ringbuffer_mask,
                                ringbuffer, &literal_cost[0]);
    literal_costs_.resize(num_bytes + 1);
    literal_costs_[0] = 0.0;
    for (size_t i = 0; i < num_bytes; ++i) {
      literal_costs_[i + 1] = literal_costs_[i] + literal_cost[i];
    }
    cost_cmd_.resize(kNumCommandPrefixes);
    cost_dist_.resize(kNumDistancePrefixes);
    for (uint32_t i = 0; i < kNumCommandPrefixes; ++i) {
      cost_cmd_[i] = FastLog2(11 + i);
    }
    for (uint32_t i = 0; i < kNumDistancePrefixes; ++i) {
      cost_dist_[i] = FastLog2(20 + i);
    }
    min_cost_cmd_ = FastLog2(11);
  }